

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O3

void BrotliZopfliCreateCommands
               (size_t num_bytes,size_t block_start,size_t max_backward_limit,ZopfliNode *nodes,
               int *dist_cache,size_t *last_insert_len,BrotliEncoderParams *params,Command *commands
               ,size_t *num_literals)

{
  uint uVar1;
  uint uVar2;
  ushort uVar3;
  uint16_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  uint16_t *puVar22;
  bool bVar23;
  
  uVar5 = (nodes->u).next;
  if (uVar5 == 0xffffffff) {
    lVar21 = 0;
  }
  else {
    puVar22 = &commands->dist_prefix_;
    lVar12 = 0;
    lVar21 = 0;
    do {
      uVar7 = (ulong)uVar5;
      uVar20 = nodes[lVar21 + uVar7].length;
      uVar14 = nodes[lVar21 + uVar7].dcode_insert_length;
      uVar13 = (ulong)(uVar14 & 0x7ffffff);
      uVar5 = nodes[lVar21 + uVar7].u.next;
      bVar23 = lVar12 == 0;
      lVar12 = lVar12 + -1;
      uVar11 = uVar13;
      if (bVar23) {
        uVar11 = *last_insert_len + uVar13;
        *last_insert_len = 0;
      }
      uVar15 = uVar20 & 0x1ffffff;
      uVar1 = nodes[lVar21 + uVar7].distance;
      iVar18 = uVar15 - (uVar20 >> 0x19);
      uVar19 = iVar18 + 9;
      uVar7 = block_start + lVar21 + uVar13;
      if (max_backward_limit <= uVar7) {
        uVar7 = max_backward_limit;
      }
      uVar2 = (uVar14 >> 0x1b) - 1;
      if (uVar14 < 0x8000000) {
        uVar2 = uVar1 + 0xf;
      }
      ((Command *)(puVar22 + -7))->insert_len_ = (uint32_t)uVar11;
      *(uint *)(puVar22 + -5) = (uVar19 - uVar20) * 0x2000000 | uVar15;
      uVar8 = (ulong)(params->dist).num_direct_distance_codes;
      uVar16 = uVar8 + 0x10;
      if (uVar2 < uVar16) {
        uVar6 = 0;
        uVar14 = uVar2;
      }
      else {
        uVar6 = (params->dist).distance_postfix_bits;
        bVar9 = (byte)uVar6;
        uVar8 = ((uVar2 - uVar8) + (4L << (bVar9 & 0x3f))) - 0x10;
        uVar20 = 0x1f;
        uVar14 = (uint)uVar8;
        if (uVar14 != 0) {
          for (; uVar14 >> uVar20 == 0; uVar20 = uVar20 - 1) {
          }
        }
        uVar10 = (uVar20 ^ 0xffffffe0) + 0x1f;
        uVar20 = (uint)((uVar8 >> ((ulong)uVar10 & 0x3f) & 1) != 0);
        iVar17 = uVar10 - uVar6;
        uVar14 = (uVar20 + iVar17 * 2 + 0xfffe << (bVar9 & 0x3f)) +
                 (int)uVar16 + (~(-1 << (bVar9 & 0x1f)) & uVar14) | iVar17 * 0x400;
        uVar6 = (uint32_t)(uVar8 - ((ulong)uVar20 + 2 << ((byte)uVar10 & 0x3f)) >> (bVar9 & 0x3f));
      }
      *puVar22 = (uint16_t)uVar14;
      *(uint32_t *)(puVar22 + -3) = uVar6;
      if (uVar11 < 6) {
        uVar16 = uVar11 & 0xffffffff;
      }
      else if (uVar11 < 0x82) {
        uVar20 = 0x1f;
        uVar10 = (uint)(uVar11 - 2);
        if (uVar10 != 0) {
          for (; uVar10 >> uVar20 == 0; uVar20 = uVar20 - 1) {
          }
        }
        uVar16 = (ulong)((int)(uVar11 - 2 >> ((char)(uVar20 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                         (uVar20 ^ 0xffffffe0) * 2 + 0x40);
      }
      else if (uVar11 < 0x842) {
        uVar10 = (uint32_t)uVar11 - 0x42;
        uVar20 = 0x1f;
        if (uVar10 != 0) {
          for (; uVar10 >> uVar20 == 0; uVar20 = uVar20 - 1) {
          }
        }
        uVar16 = (ulong)((uVar20 ^ 0xffe0) + 0x2a);
      }
      else {
        uVar16 = 0x15;
        if (0x1841 < uVar11) {
          uVar16 = (ulong)(ushort)(0x17 - (uVar11 < 0x5842));
        }
      }
      if (uVar19 < 10) {
        uVar20 = iVar18 + 7;
      }
      else if (uVar19 < 0x86) {
        uVar19 = iVar18 + 3;
        uVar20 = 0x1f;
        if (uVar19 != 0) {
          for (; uVar19 >> uVar20 == 0; uVar20 = uVar20 - 1) {
          }
        }
        uVar20 = (int)((ulong)(long)(int)uVar19 >> ((char)(uVar20 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                 (uVar20 ^ 0xffffffe0) * 2 + 0x42;
      }
      else {
        uVar20 = 0x17;
        if (uVar19 < 0x846) {
          uVar20 = 0x1f;
          if (iVar18 - 0x3dU != 0) {
            for (; iVar18 - 0x3dU >> uVar20 == 0; uVar20 = uVar20 - 1) {
            }
          }
          uVar20 = (uVar20 ^ 0xffe0) + 0x2c;
        }
      }
      uVar3 = (ushort)uVar20;
      uVar4 = (uVar3 & 7) + ((ushort)uVar16 & 7) * 8;
      if ((((uVar14 & 0x3ff) == 0) && ((ushort)uVar16 < 8)) && (uVar3 < 0x10)) {
        if (7 < uVar3) {
          uVar4 = uVar4 + 0x40;
        }
      }
      else {
        iVar18 = (int)((uVar16 & 0xffff) >> 3) * 3 + ((uVar20 & 0xffff) >> 3);
        uVar4 = uVar4 + ((ushort)(0x520d40 >> ((char)iVar18 * '\x02' & 0x1fU)) & 0xc0) +
                        (short)iVar18 * 0x40 + 0x40;
      }
      puVar22[-1] = uVar4;
      if ((uVar1 <= uVar7) && (uVar2 != 0)) {
        dist_cache[3] = dist_cache[2];
        *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
        *dist_cache = uVar1;
      }
      *num_literals = *num_literals + uVar11;
      lVar21 = lVar21 + uVar13 + (ulong)uVar15;
      puVar22 = puVar22 + 8;
    } while (uVar5 != 0xffffffff);
  }
  *last_insert_len = *last_insert_len + (num_bytes - lVar21);
  return;
}

Assistant:

void BrotliZopfliCreateCommands(const size_t num_bytes,
                                const size_t block_start,
                                const size_t max_backward_limit,
                                const ZopfliNode* nodes,
                                int* dist_cache,
                                size_t* last_insert_len,
                                const BrotliEncoderParams* params,
                                Command* commands,
                                size_t* num_literals) {
  size_t pos = 0;
  uint32_t offset = nodes[0].u.next;
  size_t i;
  size_t gap = 0;
  for (i = 0; offset != BROTLI_UINT32_MAX; i++) {
    const ZopfliNode* next = &nodes[pos + offset];
    size_t copy_length = ZopfliNodeCopyLength(next);
    size_t insert_length = next->dcode_insert_length & 0x7FFFFFF;
    pos += insert_length;
    offset = next->u.next;
    if (i == 0) {
      insert_length += *last_insert_len;
      *last_insert_len = 0;
    }
    {
      size_t distance = ZopfliNodeCopyDistance(next);
      size_t len_code = ZopfliNodeLengthCode(next);
      size_t max_distance =
          BROTLI_MIN(size_t, block_start + pos, max_backward_limit);
      BROTLI_BOOL is_dictionary = TO_BROTLI_BOOL(distance > max_distance + gap);
      size_t dist_code = ZopfliNodeDistanceCode(next);
      InitCommand(&commands[i], &params->dist, insert_length,
          copy_length, (int)len_code - (int)copy_length, dist_code);

      if (!is_dictionary && dist_code > 0) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = dist_cache[0];
        dist_cache[0] = (int)distance;
      }
    }

    *num_literals += insert_length;
    pos += copy_length;
  }
  *last_insert_len += num_bytes - pos;
}